

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::overflow
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this,int c
          )

{
  char local_20 [16];
  
  (**(code **)(*(long *)this + 0x30))();
  if (c != -1) {
    if (*(char **)&this->field_0x20 == *(char **)&this->field_0x30) {
      local_20[1] = 0;
      local_20[0] = (char)c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_20,1);
    }
    else if (*(char **)&this->field_0x28 < *(char **)&this->field_0x30) {
      **(char **)&this->field_0x28 = (char)c;
      *(long *)&this->field_0x28 = *(long *)&this->field_0x28 + 1;
    }
    else {
      (**(code **)(*(long *)this + 0x68))(this,c & 0xff);
    }
  }
  return 0;
}

Assistant:

int overflow( int c ) override {
                sync();

                if( c != EOF ) {
                    if( pbase() == epptr() )
                        m_writer( std::string( 1, static_cast<char>( c ) ) );
                    else
                        sputc( static_cast<char>( c ) );
                }
                return 0;
            }